

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall
tetgenmesh::facenormal(tetgenmesh *this,point pa,point pb,point pc,double *n,int pivot,double *lav)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double v2 [3];
  double v1 [3];
  double v3 [3];
  double local_78 [11];
  
  local_78[4] = *pb - *pa;
  local_78[5] = pb[1] - pa[1];
  local_78[6] = pb[2] - pa[2];
  local_78[0] = *pa - *pc;
  local_78[1] = pa[1] - pc[1];
  local_78[2] = pa[2] - pc[2];
  if (pivot < 1) {
    pdVar1 = local_78 + 4;
    pdVar2 = local_78;
  }
  else {
    local_78[8] = *pc - *pb;
    local_78[9] = pc[1] - pb[1];
    local_78[10] = pc[2] - pb[2];
    dVar3 = local_78[6] * local_78[6] + local_78[4] * local_78[4] + local_78[5] * local_78[5];
    dVar8 = local_78[2] * local_78[2] + local_78[0] * local_78[0] + local_78[1] * local_78[1];
    dVar7 = local_78[10] * local_78[10] + local_78[8] * local_78[8] + local_78[9] * local_78[9];
    pdVar2 = local_78 + 8;
    if (dVar3 < dVar8) {
      pdVar2 = local_78 + 4;
    }
    dVar4 = dVar8;
    pdVar1 = local_78 + 8;
    if (dVar8 <= dVar3) {
      dVar4 = dVar3;
      pdVar1 = local_78;
    }
    if (dVar4 < dVar7) {
      pdVar1 = local_78 + 4;
      pdVar2 = local_78;
    }
    if (lav != (double *)0x0) {
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      *lav = (dVar3 + dVar8 + dVar7) / 3.0;
    }
  }
  dVar5 = pdVar1[1] * pdVar2[2] - pdVar1[2] * pdVar2[1];
  *n = dVar5;
  dVar6 = *pdVar1 * pdVar2[2] - pdVar1[2] * *pdVar2;
  n[1] = -dVar6;
  dVar3 = *pdVar1;
  dVar8 = pdVar1[1];
  dVar7 = *pdVar2;
  dVar4 = pdVar2[1];
  *n = -dVar5;
  n[1] = dVar6;
  n[2] = -(dVar3 * dVar4 - dVar8 * dVar7);
  return;
}

Assistant:

void tetgenmesh::facenormal(point pa, point pb, point pc, REAL *n, int pivot,
                            REAL* lav)
{
  REAL v1[3], v2[3], v3[3], *pv1, *pv2;
  REAL L1, L2, L3;

  v1[0] = pb[0] - pa[0];  // edge vector v1: a->b
  v1[1] = pb[1] - pa[1];
  v1[2] = pb[2] - pa[2];
  v2[0] = pa[0] - pc[0];  // edge vector v2: c->a
  v2[1] = pa[1] - pc[1];
  v2[2] = pa[2] - pc[2];

  // Default, normal is calculated by: v1 x (-v2) (see Fig. fnormal).
  if (pivot > 0) {
    // Choose edge vectors by Burdakov's algorithm.
    v3[0] = pc[0] - pb[0];  // edge vector v3: b->c
    v3[1] = pc[1] - pb[1];
    v3[2] = pc[2] - pb[2];
    L1 = dot(v1, v1);
    L2 = dot(v2, v2);
    L3 = dot(v3, v3);
    // Sort the three edge lengths.
    if (L1 < L2) {
      if (L2 < L3) {
        pv1 = v1; pv2 = v2; // n = v1 x (-v2).
      } else {
        pv1 = v3; pv2 = v1; // n = v3 x (-v1).
      }
    } else {
      if (L1 < L3) {
        pv1 = v1; pv2 = v2; // n = v1 x (-v2).
      } else {
        pv1 = v2; pv2 = v3; // n = v2 x (-v3).
      }
    }
    if (lav) {
      // return the average edge length.
      *lav = (sqrt(L1) + sqrt(L2) + sqrt(L3)) / 3.0;
    }
  } else {
    pv1 = v1; pv2 = v2; // n = v1 x (-v2).
  }

  // Calculate the face normal.
  cross(pv1, pv2, n);
  // Inverse the direction;
  n[0] = -n[0];
  n[1] = -n[1];
  n[2] = -n[2];
}